

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O0

void add_source_fdtd_2D(source_type sType,fdtd2D *fdtd,fdtd_source src,float_type positionX,
                       float_type positionY)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  void *pvVar6;
  undefined8 *puVar7;
  double *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double in_XMM1_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  uintmax_t (*MsourceLocations) [2];
  uintmax_t (*JsourceLocations) [2];
  uintmax_t posY;
  uintmax_t posX;
  float_type posYf;
  float_type posXf;
  
  auVar8._0_8_ = in_XMM0_Qa / *in_RSI;
  auVar8._8_8_ = 0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar8._0_8_;
  auVar3 = vroundsd_avx(auVar8,auVar10,9);
  auVar9._0_8_ = in_XMM1_Qa / in_RSI[1];
  auVar9._8_8_ = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar9._0_8_;
  auVar8 = vroundsd_avx(auVar9,auVar11,9);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar3._0_8_;
  dVar4 = (double)vcvttsd2usi_avx512f(auVar1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar8._0_8_;
  dVar5 = (double)vcvttsd2usi_avx512f(auVar3);
  if ((ulong)in_RSI[0x19] <= (ulong)dVar4) {
    fprintf(_stderr,"add_source_fdtd_2D: adding source outside of the X dimension boundaries\n");
    exit(1);
  }
  if ((ulong)in_RSI[0x1a] <= (ulong)dVar5) {
    fprintf(_stderr,"add_source_fdtd_2D: adding source outside of the Y dimension boundaries\n");
    exit(1);
  }
  if (in_EDI == 0) {
    *(int *)(in_RSI + 0x1f) = *(int *)(in_RSI + 0x1f) + 1;
    pvVar6 = realloc((void *)in_RSI[0x21],(ulong)*(uint *)(in_RSI + 0x1f) << 4);
    in_RSI[0x21] = (double)pvVar6;
    dVar2 = in_RSI[0x21];
    *(double *)((long)dVar2 + (ulong)(*(int *)(in_RSI + 0x1f) - 1) * 0x10) = dVar4;
    *(double *)((long)dVar2 + (ulong)(*(int *)(in_RSI + 0x1f) - 1) * 0x10 + 8) = dVar5;
    pvVar6 = realloc((void *)in_RSI[0x20],(ulong)*(uint *)(in_RSI + 0x1f) << 5);
    in_RSI[0x20] = (double)pvVar6;
    puVar7 = (undefined8 *)((long)in_RSI[0x20] + (ulong)(*(int *)(in_RSI + 0x1f) - 1) * 0x20);
    *puVar7 = in_stack_00000008;
    puVar7[1] = in_stack_00000010;
    puVar7[2] = MsourceLocations;
    puVar7[3] = JsourceLocations;
  }
  else if (in_EDI == 1) {
    *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + 1;
    pvVar6 = realloc((void *)in_RSI[0x1e],(ulong)*(uint *)(in_RSI + 0x1c) << 4);
    in_RSI[0x1e] = (double)pvVar6;
    dVar2 = in_RSI[0x1e];
    *(double *)((long)dVar2 + (ulong)(*(int *)(in_RSI + 0x1c) - 1) * 0x10) = dVar4;
    *(double *)((long)dVar2 + (ulong)(*(int *)(in_RSI + 0x1c) - 1) * 0x10 + 8) = dVar5;
    pvVar6 = realloc((void *)in_RSI[0x1d],(ulong)*(uint *)(in_RSI + 0x1c) << 5);
    in_RSI[0x1d] = (double)pvVar6;
    puVar7 = (undefined8 *)((long)in_RSI[0x1d] + (ulong)(*(int *)(in_RSI + 0x1c) - 1) * 0x20);
    *puVar7 = in_stack_00000008;
    puVar7[1] = in_stack_00000010;
    puVar7[2] = MsourceLocations;
    puVar7[3] = JsourceLocations;
  }
  return;
}

Assistant:

void add_source_fdtd_2D(enum source_type sType, struct fdtd2D *fdtd,
                        struct fdtd_source src, float_type positionX,
                        float_type positionY) {
  float_type posXf = floor(positionX / fdtd->dx);
  float_type posYf = floor(positionY / fdtd->dy);
  uintmax_t posX = (uintmax_t)posXf;
  uintmax_t posY = (uintmax_t)posYf;
  if (posX >= fdtd->sizeX) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the X "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  if (posY >= fdtd->sizeY) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the Y "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  switch (sType) {
  case source_electric: {
    fdtd->num_Jsources++;
    fdtd->JsourceLocations = realloc(
        fdtd->JsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Jsources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Jsources, 2, JsourceLocations,
                      fdtd->JsourceLocations);
    JsourceLocations[fdtd->num_Jsources - 1][0] = posX;
    JsourceLocations[fdtd->num_Jsources - 1][1] = posY;
    fdtd->Jsources =
        realloc(fdtd->Jsources, fdtd->num_Jsources * sizeof(*fdtd->Jsources));
    fdtd->Jsources[fdtd->num_Jsources - 1] = src;
    break;
  }
  case source_magnetic:
    fdtd->num_Msources++;
    fdtd->MsourceLocations = realloc(
        fdtd->MsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Msources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Msources, 2, MsourceLocations,
                      fdtd->MsourceLocations);
    MsourceLocations[fdtd->num_Msources - 1][0] = posX;
    MsourceLocations[fdtd->num_Msources - 1][1] = posY;
    fdtd->Msources =
        realloc(fdtd->Msources, fdtd->num_Msources * sizeof(*fdtd->Msources));
    fdtd->Msources[fdtd->num_Msources - 1] = src;
    break;
  }
}